

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O2

void __thiscall dxil_spv::CFGStructurizer::find_selection_merges(CFGStructurizer *this,uint pass)

{
  MergeType MVar1;
  pointer ppCVar2;
  bool bVar3;
  uint uVar4;
  CFGNode *pCVar5;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  _Var6;
  pointer ppCVar7;
  LoggingCallback p_Var8;
  void *pvVar9;
  CFGNode *pCVar10;
  CFGNode *pCVar11;
  pointer ppCVar12;
  CFGNode *node;
  Vector<CFGNode_*> *local_1040;
  char buffer [4096];
  
  ppCVar12 = (this->forward_post_visit_order).
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppCVar2 = (this->forward_post_visit_order).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppCVar12 == ppCVar2) {
      return;
    }
    node = *ppCVar12;
    uVar4 = CFGNode::num_forward_preds(node);
    if ((1 < uVar4) && (node->succ_back_edge == (CFGNode *)0x0 || node->succ_back_edge == node)) {
      pCVar11 = node->immediate_dominator;
      if ((ulong)((long)(pCVar11->succ).
                        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pCVar11->succ).
                       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_start) < 9) {
        __assert_fail("idom->succ.size() >= 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                      ,0x12fb,"void dxil_spv::CFGStructurizer::find_selection_merges(unsigned int)")
        ;
      }
      pCVar5 = CFGNode::get_outer_selection_dominator(node);
      if ((pCVar5 == (CFGNode *)0x0) || ((pCVar5->ir).terminator.type != Switch)) {
LAB_00134485:
        for (ppCVar7 = (node->headers).
                       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppCVar7 !=
            (node->headers).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish; ppCVar7 = ppCVar7 + 1) {
          pCVar5 = *ppCVar7;
          if ((*ppCVar7)->forward_post_visit_order <= pCVar11->forward_post_visit_order) {
            pCVar5 = pCVar11;
          }
          pCVar11 = pCVar5;
        }
        if (pCVar11->pred_back_edge == (CFGNode *)0x0) {
          pCVar5 = get_innermost_loop_header_for(this,pCVar11);
          if ((pCVar5 != (CFGNode *)0x0) && (pCVar5->loop_ladder_block == node)) {
            pCVar11 = pCVar5;
          }
        }
        if (pass == 0) {
          pCVar5 = CFGNode::find_common_post_dominator(pCVar11,node);
          if ((pCVar5 != (CFGNode *)0x0) && (pCVar5->immediate_post_dominator == pCVar5)) {
            bVar3 = CFGNode::dominates_all_reachable_exits(node);
            if (bVar3) {
              bVar3 = CFGNode::post_dominates(pCVar11,this->entry_block);
              if (!bVar3) {
                pCVar5 = find_break_target_for_selection_construct(this,pCVar11,node);
                if (pCVar5 != (CFGNode *)0x0) {
                  bVar3 = CFGNode::dominates(pCVar11,pCVar5);
                  if ((bVar3) &&
                     ((pCVar5->headers).
                      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start ==
                      (pCVar5->headers).
                      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish)) {
                    local_1040 = &pCVar5->headers;
                    buffer._0_8_ = create_helper_pred_block(this,pCVar11);
                    ((CFGNode *)buffer._0_8_)->merge = Loop;
                    ((CFGNode *)buffer._0_8_)->loop_merge_block = pCVar5;
                    ((CFGNode *)buffer._0_8_)->freeze_structured_analysis = true;
                    std::
                    vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    ::push_back(local_1040,(value_type *)buffer);
                  }
                }
              }
            }
          }
        }
        MVar1 = pCVar11->merge;
        if (MVar1 != Selection) {
          if (MVar1 == Loop) {
            if (pCVar11->loop_merge_block == node) {
              if (pCVar11->loop_ladder_block != (CFGNode *)0x0) {
                pCVar11 = create_helper_pred_block(this,pCVar11);
                pCVar11->merge = Loop;
                pCVar11->loop_merge_block = node;
                pCVar11->freeze_structured_analysis = true;
                goto LAB_00134742;
              }
            }
            else if (pCVar11->loop_ladder_block != node) {
              pCVar11 = create_helper_succ_block(this,pCVar11);
              pCVar11->merge = Selection;
              pCVar11->selection_merge_block = node;
LAB_00134742:
              CFGNode::add_unique_header(node,pCVar11);
            }
            goto LAB_0013441e;
          }
          if (MVar1 != None) {
            p_Var8 = get_thread_log_callback();
            if (p_Var8 == (LoggingCallback)0x0) {
              fprintf(_stderr,"[WARN]: Cannot merge execution for node %p (%s).\n",node,
                      (node->name)._M_dataplus._M_p);
              fflush(_stderr);
            }
            else {
              snprintf(buffer,0x1000,"Cannot merge execution for node %p (%s).\n",node,
                       (node->name)._M_dataplus._M_p);
              pvVar9 = get_thread_log_callback_userdata();
              (*p_Var8)(pvVar9,Warn,buffer);
            }
            goto LAB_0013441e;
          }
        }
        if ((pCVar11->ir).terminator.type != Switch) {
          if (MVar1 == Selection) {
            if (pass != 0) {
              p_Var8 = get_thread_log_callback();
              if (p_Var8 == (LoggingCallback)0x0) {
                fwrite("[WARN]: Mismatch headers in pass 1 ... ?\n",0x29,1,_stderr);
                fflush(_stderr);
              }
              else {
                builtin_strncpy(buffer,"Mismatch headers in pass 1 ... ?\n",0x22);
                pvVar9 = get_thread_log_callback_userdata();
                (*p_Var8)(pvVar9,Warn,buffer);
              }
              goto LAB_00134563;
            }
            if (pCVar11->selection_merge_block == (CFGNode *)0x0) {
              __assert_fail("idom->selection_merge_block",
                            "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                            ,0x1351,
                            "void dxil_spv::CFGStructurizer::find_selection_merges(unsigned int)");
            }
            pCVar10 = CFGNode::find_common_post_dominator(pCVar11->selection_merge_block,pCVar11);
            pCVar5 = pCVar11->selection_merge_block;
            if (pCVar10 != pCVar5 && pCVar10 != (CFGNode *)0x0) {
              pCVar11->loop_ladder_block = pCVar5;
              pCVar5 = pCVar10;
            }
            pCVar11->loop_merge_block = pCVar5;
            CFGNode::add_unique_header(pCVar5,pCVar11);
            pCVar11->merge = Loop;
            pCVar11->selection_merge_block = (CFGNode *)0x0;
            pCVar11->freeze_structured_analysis = true;
            pCVar11 = create_helper_succ_block(this,pCVar11);
          }
          else {
LAB_00134563:
            if (pass == 1) {
              uVar4 = CFGNode::num_forward_preds(node);
              if ((2 < uVar4) && (pCVar11->merge == None)) {
                pCVar11->merge = Loop;
                CFGNode::add_unique_header(node,pCVar11);
                pCVar11->loop_merge_block = node;
                pCVar11->freeze_structured_analysis = true;
                goto LAB_0013441e;
              }
            }
          }
          pCVar11->merge = Selection;
          CFGNode::add_unique_header(node,pCVar11);
          if (node == (CFGNode *)0x0) {
            __assert_fail("node",
                          "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                          ,0x1383,
                          "void dxil_spv::CFGStructurizer::find_selection_merges(unsigned int)");
          }
          pCVar11->selection_merge_block = node;
        }
      }
      else if (pCVar5->selection_merge_block != node) {
        _Var6 = std::
                __find_if<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Iter_equals_val<dxil_spv::CFGNode*const>>
                          ((pCVar5->succ).
                           super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           (pCVar5->succ).
                           super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&node);
        if (_Var6._M_current ==
            (pCVar5->succ).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00134485;
      }
    }
LAB_0013441e:
    ppCVar12 = ppCVar12 + 1;
  } while( true );
}

Assistant:

void CFGStructurizer::find_selection_merges(unsigned pass)
{
	for (auto *node : forward_post_visit_order)
	{
		if (node->num_forward_preds() <= 1)
			continue;

		// Never merge to continue block.
		// We should never hit this path unless we explicitly
		// avoided creating a continue ladder block earlier.
		if (block_is_plain_continue(node))
			continue;

		// If there are 2 or more pred edges, try to merge execution.

		// The idom is the natural header block.
		auto *idom = node->immediate_dominator;
		assert(idom->succ.size() >= 2);

		// Check for case fallthrough here. In this case, we do not have a merge scenario, just ignore.
		auto *inner_header = node->get_outer_selection_dominator();
		if (inner_header && inner_header->ir.terminator.type == Terminator::Type::Switch)
		{
			if (inner_header->selection_merge_block == node)
			{
				// We just found a switch block which we have already handled.
				continue;
			}

			if (std::find(inner_header->succ.begin(), inner_header->succ.end(), node) != inner_header->succ.end())
			{
				// Fallthrough.
				continue;
			}
		}

		for (auto *header : node->headers)
		{
			// If we have a loop header already associated with this block, treat that as our idom.
			if (header->forward_post_visit_order > idom->forward_post_visit_order)
				idom = header;
		}

		// Similar, but also check if we have associated ladder blocks with the idom.
		if (!idom->pred_back_edge)
		{
			auto *inner_loop_header = get_innermost_loop_header_for(idom);
			if (inner_loop_header && inner_loop_header->loop_ladder_block == node)
				idom = const_cast<CFGNode *>(inner_loop_header);
		}

		if (pass == 0)
		{
			// Check that we're not merging ourselves into the aether.
			// This is a scenario that can happen if we attempt to merge to a block which terminates the CFG
			// (return or unreachable),
			// but does not post-dominate the idom candidate,
			// i.e. the selection construct needs to break to some other scope.
			// If this happens, we won't be able to register a typical breaking scenario
			// (since post-domination analysis won't help us),
			// and we need to do some magic fixups.

			auto *merge_candidate = CFGNode::find_common_post_dominator(idom, node);
			bool post_dominator_is_exit_node =
				merge_candidate && merge_candidate->immediate_post_dominator == merge_candidate;
			bool merged_into_terminating_path = post_dominator_is_exit_node && node->dominates_all_reachable_exits();

			// If our candidate idom post dominates the entry block, we consider this the main path of execution.
			if (merged_into_terminating_path && idom->post_dominates(entry_block))
				merged_into_terminating_path = false;

			if (merged_into_terminating_path)
			{
				// Similar to loops, find the break target for this construct.
				auto *break_target = find_break_target_for_selection_construct(idom, node);

				// Have not observed any scenario where we won't have a dominated break target we can use.
				if (break_target && idom->dominates(break_target) && break_target->headers.empty())
				{
					// Enclose this scope in a loop.
					auto *helper_pred = create_helper_pred_block(idom);
					helper_pred->merge = MergeType::Loop;
					helper_pred->loop_merge_block = break_target;
					helper_pred->freeze_structured_analysis = true;
					break_target->headers.push_back(helper_pred);
				}
			}
		}

		if (idom->merge == MergeType::None || idom->merge == MergeType::Selection)
		{
			// We just found a switch block which we have already handled.
			if (idom->ir.terminator.type == Terminator::Type::Switch)
				continue;

			// If the idom is already a selection construct, this must mean
			// we have some form of breaking construct inside this inner construct.
			// This fooled find_selection_merges() to think we had a selection merge target at the break target.
			// Fix this up here, where we rewrite the outer construct as a fixed loop instead.
			if (idom->merge == MergeType::Selection)
			{
				if (pass == 0)
				{
					assert(idom->selection_merge_block);

					// If we turn the outer selection construct into a loop,
					// we remove the possibility to break further out (without adding ladders like we do for loops).
					// To make this work, we must ensure that the new merge block post-dominates the loop and selection merge.
					auto *merge_candidate = CFGNode::find_common_post_dominator(idom->selection_merge_block, idom);

					if (!merge_candidate || merge_candidate == idom->selection_merge_block)
					{
						idom->loop_merge_block = idom->selection_merge_block;
					}
					else
					{
						// Make sure we split merge scopes. Pretend we have a true loop.
						idom->loop_ladder_block = idom->selection_merge_block;
						idom->loop_merge_block = merge_candidate;
					}

					idom->loop_merge_block->add_unique_header(idom);

					idom->merge = MergeType::Loop;
					idom->selection_merge_block = nullptr;
					idom->freeze_structured_analysis = true;
					idom = create_helper_succ_block(idom);
				}
				else
					LOGW("Mismatch headers in pass 1 ... ?\n");
			}

			// If we're in a pass 1, opting for a selection merge better make sure that we can
			// actually use this as a merge block.
			// If we have more than 2 preds, there is no way this is not a break block merge.
			// It is not a switch statement and selections spawn two new scopes.
			// We should have resolved this in pass 0, but it can slip through the cracks if there
			// are multiple interleaving merge scopes in play.
			bool force_loop = pass == 1 &&
			                  node->num_forward_preds() > 2 &&
			                  idom->merge == MergeType::None;

			if (force_loop)
			{
				idom->merge = MergeType::Loop;
				node->add_unique_header(idom);
				idom->loop_merge_block = node;
				idom->freeze_structured_analysis = true;
			}
			else
			{
				idom->merge = MergeType::Selection;
				node->add_unique_header(idom);
				assert(node);
				idom->selection_merge_block = node;
				//LOGI("Selection merge: %p (%s) -> %p (%s)\n", static_cast<const void *>(idom), idom->name.c_str(),
				//     static_cast<const void *>(node), node->name.c_str());
			}
		}
		else if (idom->merge == MergeType::Loop)
		{
			if (idom->loop_merge_block == node && idom->loop_ladder_block)
			{
				// We need to create an outer shell for this header since we need to ladder break to this node.
				auto *loop = create_helper_pred_block(idom);
				loop->merge = MergeType::Loop;
				loop->loop_merge_block = node;
				loop->freeze_structured_analysis = true;
				node->add_unique_header(loop);
				//LOGI("Loop merge: %p (%s) -> %p (%s)\n", static_cast<const void *>(loop), loop->name.c_str(),
				//     static_cast<const void *>(node), node->name.c_str());
			}
			else if (idom->loop_merge_block != node && idom->loop_ladder_block != node)
			{
				auto *selection_idom = create_helper_succ_block(idom);
				// If we split the loop header into the loop header -> selection merge header,
				// then we can merge into a continue block for example.
				selection_idom->merge = MergeType::Selection;
				selection_idom->selection_merge_block = node;
				node->add_unique_header(selection_idom);
				//LOGI("Selection merge: %p (%s) -> %p (%s)\n", static_cast<const void *>(selection_idom),
				//     selection_idom->name.c_str(), static_cast<const void *>(node), node->name.c_str());
			}
		}
		else
		{
			// We are hosed. There is no obvious way to merge execution here.
			// This might be okay.
			LOGW("Cannot merge execution for node %p (%s).\n", static_cast<const void *>(node), node->name.c_str());
		}
	}
}